

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xatlas.cpp
# Opt level: O3

bool xatlas::internal::Fit::computeLeastSquaresNormal
               (Vector3 *points,uint32_t pointsCount,Vector3 *normal)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined8 uVar3;
  long lVar6;
  bool bVar7;
  long lVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  Vector3 VVar22;
  Vector3 local_18;
  
  if (pointsCount < 3) {
    __assert_fail("pointsCount >= 3",
                  "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/xatlas/xatlas.cpp"
                  ,0x66c,
                  "static bool xatlas::internal::Fit::computeLeastSquaresNormal(const Vector3 *, uint32_t, Vector3 *)"
                 );
  }
  if (pointsCount == 3) {
    fVar9 = points[2].x - points->x;
    uVar1 = points[2].y;
    uVar4 = points[2].z;
    uVar2 = points->y;
    uVar5 = points->z;
    fVar12 = points[1].y - (float)uVar2;
    fVar17 = points[1].z - (float)uVar5;
    fVar18 = points[1].x - points->x;
    local_18.z = fVar9 * fVar12 - fVar18 * ((float)uVar1 - (float)uVar2);
    local_18.y = ((float)uVar4 - (float)uVar5) * fVar18 - fVar17 * fVar9;
    local_18.x = ((float)uVar1 - (float)uVar2) * fVar17 - fVar12 * ((float)uVar4 - (float)uVar5);
    VVar22 = normalize(&local_18,local_18.z);
    *normal = VVar22;
    bVar7 = true;
  }
  else {
    lVar6 = (ulong)pointsCount * 0xc;
    fVar12 = 0.0;
    fVar17 = 0.0;
    fVar9 = 0.0;
    lVar8 = 0;
    do {
      uVar3 = *(undefined8 *)((long)&points->x + lVar8);
      fVar12 = fVar12 + (float)uVar3;
      fVar17 = fVar17 + (float)((ulong)uVar3 >> 0x20);
      fVar9 = fVar9 + *(float *)((long)&points->z + lVar8);
      lVar8 = lVar8 + 0xc;
    } while (lVar6 != lVar8);
    fVar16 = 1.0 / (float)pointsCount;
    fVar18 = 0.0;
    fVar10 = 0.0;
    fVar11 = 0.0;
    lVar8 = 0;
    fVar15 = 0.0;
    fVar13 = 0.0;
    fVar14 = 0.0;
    do {
      uVar3 = *(undefined8 *)((long)&points->x + lVar8);
      fVar19 = (float)uVar3 - fVar16 * fVar12;
      fVar20 = (float)((ulong)uVar3 >> 0x20) - fVar16 * fVar17;
      fVar21 = *(float *)((long)&points->z + lVar8) - fVar16 * fVar9;
      fVar11 = fVar11 + fVar20 * fVar19;
      fVar13 = fVar13 + fVar19 * fVar19;
      fVar14 = fVar14 + fVar20 * fVar20;
      fVar18 = fVar18 + fVar21 * fVar19;
      fVar10 = fVar10 + fVar21 * fVar20;
      fVar15 = fVar15 + fVar21 * fVar21;
      lVar8 = lVar8 + 0xc;
    } while (lVar6 != lVar8);
    fVar19 = -fVar10;
    fVar20 = -fVar18;
    fVar17 = fVar14 * fVar15 + fVar10 * fVar19;
    fVar12 = fVar13 * fVar15 + fVar18 * fVar20;
    fVar16 = fVar13 * fVar14 - fVar11 * fVar11;
    fVar9 = fVar12;
    if (fVar12 <= fVar16) {
      fVar9 = fVar16;
    }
    fVar21 = fVar17;
    if (fVar17 <= fVar9) {
      fVar21 = fVar9;
    }
    if (0.0 < fVar21) {
      if ((fVar21 != fVar17) || (NAN(fVar21) || NAN(fVar17))) {
        if ((fVar21 != fVar12) || (NAN(fVar21) || NAN(fVar12))) {
          if ((fVar21 != fVar16) || (NAN(fVar21) || NAN(fVar16))) {
            fVar12 = 0.0;
            fVar17 = 0.0;
            fVar16 = 0.0;
          }
          else {
            fVar12 = fVar11 * fVar18 + fVar13 * fVar19;
            fVar17 = fVar11 * fVar10 + fVar14 * fVar20;
          }
        }
        else {
          fVar17 = fVar10 * fVar18 + fVar15 * -fVar11;
          fVar16 = fVar11 * fVar18 + fVar13 * fVar19;
        }
      }
      else {
        fVar12 = fVar18 * fVar10 + fVar15 * -fVar11;
        fVar16 = fVar11 * fVar10 + fVar14 * fVar20;
      }
      fVar9 = SQRT(fVar16 * fVar16 + fVar17 * fVar17 + fVar12 * fVar12);
      if (0.0001 < ABS(fVar9)) {
        fVar9 = 1.0 / fVar9;
        fVar16 = fVar16 * fVar9;
        fVar12 = fVar12 * fVar9;
        fVar17 = fVar17 * fVar9;
        normal->x = fVar17;
        normal->y = fVar12;
        normal->z = fVar16;
        fVar9 = SQRT(fVar16 * fVar16 + fVar17 * fVar17 + fVar12 * fVar12);
        fVar12 = ABS(fVar9);
        if (fVar12 <= 1.0) {
          fVar12 = 1.0;
        }
        return ABS(fVar9 + -1.0) <= fVar12 * 0.001;
      }
    }
    bVar7 = false;
  }
  return bVar7;
}

Assistant:

static bool computeLeastSquaresNormal(const Vector3 *points, uint32_t pointsCount, Vector3 *normal)
	{
		XA_DEBUG_ASSERT(pointsCount >= 3);
		if (pointsCount == 3) {
			*normal = normalize(cross(points[2] - points[0], points[1] - points[0]), kEpsilon);
			return true;
		}
		const float invN = 1.0f / float(pointsCount);
		Vector3 centroid(0.0f);
		for (uint32_t i = 0; i < pointsCount; i++)
			centroid += points[i];
		centroid *= invN;
		// Calculate full 3x3 covariance matrix, excluding symmetries:
		float xx = 0.0f, xy = 0.0f, xz = 0.0f, yy = 0.0f, yz = 0.0f, zz = 0.0f;
		for (uint32_t i = 0; i < pointsCount; i++) {
			Vector3 r = points[i] - centroid;
			xx += r.x * r.x;
			xy += r.x * r.y;
			xz += r.x * r.z;
			yy += r.y * r.y;
			yz += r.y * r.z;
			zz += r.z * r.z;
		}
#if 0
		xx *= invN;
		xy *= invN;
		xz *= invN;
		yy *= invN;
		yz *= invN;
		zz *= invN;
		Vector3 weighted_dir(0.0f);
		{
			float det_x = yy * zz - yz * yz;
			const Vector3 axis_dir(det_x, xz * yz - xy * zz, xy * yz - xz * yy);
			float weight = det_x * det_x;
			if (dot(weighted_dir, axis_dir) < 0.0f)
				weight = -weight;
			weighted_dir += axis_dir * weight;
		}
		{
			float det_y = xx * zz - xz * xz;
			const Vector3 axis_dir(xz * yz - xy * zz, det_y, xy * xz - yz * xx);
			float weight = det_y * det_y;
			if (dot(weighted_dir, axis_dir) < 0.0f)
				weight = -weight;
			weighted_dir += axis_dir * weight;
		}
		{
			float det_z = xx * yy - xy * xy;
			const Vector3 axis_dir(xy * yz - xz * yy, xy * xz - yz * xx, det_z);
			float weight = det_z * det_z;
			if (dot(weighted_dir, axis_dir) < 0.0f)
				weight = -weight;
			weighted_dir += axis_dir * weight;
		}
		*normal = normalize(weighted_dir, kEpsilon);
#else
		const float det_x = yy * zz - yz * yz;
		const float det_y = xx * zz - xz * xz;
		const float det_z = xx * yy - xy * xy;
		const float det_max = max(det_x, max(det_y, det_z));
		if (det_max <= 0.0f)
			return false; // The points don't span a plane
		// Pick path with best conditioning:
		Vector3 dir(0.0f);
		if (det_max == det_x)
			dir = Vector3(det_x,xz * yz - xy * zz,xy * yz - xz * yy);
		else if (det_max == det_y)
			dir = Vector3(xz * yz - xy * zz, det_y, xy * xz - yz * xx);
		else if (det_max == det_z)
			dir = Vector3(xy * yz - xz * yy, xy * xz - yz * xx, det_z);
		const float len = length(dir);
		if (isZero(len, kEpsilon))
			return false;
		*normal = dir * (1.0f / len);
#endif
		return isNormalized(*normal);
	}